

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

Builder * arangodb::velocypack::Collection::keep
                    (Slice slice,
                    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *keys)

{
  string_view attrName;
  bool bVar1;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  sub;
  int __fd;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_RSI;
  Builder *in_RDI;
  string key;
  ObjectIterator it;
  Builder *b;
  Value *in_stack_ffffffffffffff18;
  Slice in_stack_ffffffffffffff20;
  ObjectIterator *in_stack_ffffffffffffff28;
  Slice in_stack_ffffffffffffff30;
  undefined1 translate;
  Builder *pBVar2;
  __sv_type in_stack_ffffffffffffff50;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_98;
  uint8_t *local_90;
  Slice in_stack_ffffffffffffffa0;
  
  pBVar2 = in_RDI;
  Builder::Builder((Builder *)in_stack_ffffffffffffff50._M_len);
  Value::Value((Value *)in_stack_ffffffffffffff30._start,
               (ValueType)((ulong)in_stack_ffffffffffffff28 >> 0x38),
               SUB81((ulong)in_stack_ffffffffffffff28 >> 0x30,0));
  Builder::add((Builder *)in_stack_ffffffffffffff20._start,in_stack_ffffffffffffff18);
  ObjectIterator::ObjectIterator
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
             SUB81((ulong)in_stack_ffffffffffffff20._start >> 0x38,0));
  while( true ) {
    translate = (undefined1)((ulong)in_stack_ffffffffffffff30._start >> 0x38);
    __fd = (int)in_RSI;
    bVar1 = ObjectIterator::valid((ObjectIterator *)&stack0xffffffffffffffa0);
    if (!bVar1) break;
    in_stack_ffffffffffffff30 = ObjectIterator::key((ObjectIterator *)in_RDI,(bool)translate);
    local_90 = in_stack_ffffffffffffff30._start;
    SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::copyString_abi_cxx11_
              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               in_stack_ffffffffffffffa0._start);
    sub._M_cur = (__node_type *)
                 std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffff18,(key_type *)0x1199fa);
    local_98._M_cur = sub._M_cur;
    local_a0._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff18);
    in_RSI = &local_a0;
    bVar1 = std::__detail::operator==(&local_98,in_RSI);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff50 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffff20._start);
      in_stack_ffffffffffffff20 = ObjectIterator::value((ObjectIterator *)in_RDI);
      in_RSI = (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)in_stack_ffffffffffffff50._M_len;
      attrName._M_str = (char *)pBVar2;
      attrName._M_len = (size_t)in_RDI;
      Builder::add((Builder *)in_stack_ffffffffffffff30._start,attrName,(Slice *)sub._M_cur);
    }
    ObjectIterator::next((ObjectIterator *)in_stack_ffffffffffffff50._M_len);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff20._start);
  }
  Builder::close(in_RDI,__fd);
  return pBVar2;
}

Assistant:

Builder Collection::keep(Slice slice,
                         std::unordered_set<std::string> const& keys) {
  Builder b;
  b.add(Value(ValueType::Object));

  ObjectIterator it(slice, /*useSequentialIteration*/ false);

  while (it.valid()) {
    auto key = it.key(true).copyString();
    if (keys.find(key) != keys.end()) {
      b.add(key, it.value());
    }
    it.next();
  }

  b.close();
  return b;
}